

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nick.cpp
# Opt level: O3

void __thiscall Enterprise::Nick::output_pixel<2,false>(Nick *this,uint16_t *target,int columns)

{
  byte bVar1;
  byte bVar2;
  uint8_t *puVar3;
  long lVar4;
  
  if (0 < columns) {
    puVar3 = this->ram_;
    lVar4 = 0;
    do {
      bVar1 = puVar3[(int)lVar4 + (uint)this->line_data_pointer_[0] & 0xffff];
      bVar2 = puVar3[(uint)this->line_data_pointer_[0] + (int)lVar4 + 1 & 0xffff];
      this->last_read_ = bVar2;
      target[lVar4 * 4] = this->palette_[bVar1 >> 2 & 2 | (uint)(bVar1 >> 7)];
      target[lVar4 * 4 + 1] = this->palette_[bVar1 >> 1 & 2 | bVar1 >> 6 & 1];
      target[lVar4 * 4 + 2] = this->palette_[bVar1 & 2 | bVar1 >> 5 & 1];
      target[lVar4 * 4 + 3] = this->palette_[(bVar1 >> 4 & 1) + (bVar1 & 1) * 2];
      target[lVar4 * 4 + 4] = this->palette_[bVar2 >> 2 & 2 | (uint)(bVar2 >> 7)];
      target[lVar4 * 4 + 5] = this->palette_[bVar2 >> 1 & 2 | bVar2 >> 6 & 1];
      target[lVar4 * 4 + 6] = this->palette_[bVar2 & 2 | bVar2 >> 5 & 1];
      target[lVar4 * 4 + 7] = this->palette_[(bVar2 >> 4 & 1) + (bVar2 & 1) * 2];
      lVar4 = lVar4 + 2;
      columns = columns + -1;
    } while (columns != 0);
  }
  return;
}

Assistant:

void Nick::output_pixel(uint16_t *target, int columns) const {
	static_assert(bpp == 1 || bpp == 2 || bpp == 4 || bpp == 8);

	int index = 0;
	for(int c = 0; c < columns; c++) {
		uint8_t pixels[2] = {
			ram_[(line_data_pointer_[0] + index) & 0xffff],
			ram_[(line_data_pointer_[0] + index + 1) & 0xffff]
		};
		index += is_lpixel ? 1 : 2;
		last_read_ = pixels[1];

		switch(bpp) {
			default:
			case 1: {
				const uint16_t *palette = alt_ind_palettes[((pixels[0] >> 6) & 0x02) | (pixels[0]&1)];
				pixels[0] &= two_colour_mask_;
				output1bpp(pixels[0]);

				if constexpr (!is_lpixel) {
					palette = alt_ind_palettes[((pixels[1] >> 6) & 0x02) | (pixels[1]&1)];
					pixels[1] &= two_colour_mask_;
					output1bpp(pixels[1]);
				}
			} break;

			case 2:
				output2bpp(pixels[0]);
				if constexpr (!is_lpixel) {
					output2bpp(pixels[1]);
				}
			break;

			case 4:
				output4bpp(pixels[0]);
				if constexpr (!is_lpixel) {
					output4bpp(pixels[1]);
				}
			break;

			case 8:
				output8bpp(pixels[0]);
				if constexpr (!is_lpixel) {
					output8bpp(pixels[1]);
				}
			break;
		}
	}
}